

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O1

BOOL Internal_ExtractFormatW
               (CPalThread *pthrCurrent,LPCWSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,
               LPINT Precision,LPINT Prefix,LPINT Type)

{
  WCHAR WVar1;
  int iVar2;
  size_t sVar3;
  char *__nptr;
  int *piVar4;
  LPCWSTR pWVar5;
  uint uVar6;
  LPSTR pCVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  BOOL BVar11;
  LPSTR pCVar12;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pWVar5 = *Fmt;
  if (pWVar5 == (LPCWSTR)0x0) {
    return 0;
  }
  if (*pWVar5 != L'%') {
    return 0;
  }
  *Fmt = pWVar5 + 1;
  *Out = '%';
  sVar3 = PAL_wcslen(*Fmt);
  __nptr = (char *)CorUnix::InternalMalloc(sVar3 + 1);
  if (__nptr != (char *)0x0) {
    do {
      pCVar12 = Out + 1;
      pWVar5 = *Fmt;
      WVar1 = *pWVar5;
      uVar9 = *Flags;
      uVar8 = (uint)(ushort)WVar1;
      if ((ushort)WVar1 < 0x2b) {
        if (WVar1 == L' ') {
          uVar6 = 8;
        }
        else {
          if (WVar1 != L'#') goto LAB_0011a877;
          uVar6 = 2;
        }
      }
      else if (WVar1 == L'0') {
        uVar6 = 4;
      }
      else {
        uVar6 = 1;
        if (uVar8 != 0x2d) {
          if (uVar8 != 0x2b) goto LAB_0011a877;
          uVar6 = 0x10;
        }
      }
      *Flags = uVar9 | uVar6;
      *Fmt = pWVar5 + 1;
      *pCVar12 = (CHAR)WVar1;
      Out = pCVar12;
    } while( true );
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    piVar4 = __errno_location();
    *piVar4 = 8;
    return 0;
  }
  goto LAB_0011ad32;
LAB_0011a877:
  if ((~uVar9 & 5) == 0) {
    *Flags = uVar9 - 4;
  }
  iVar2 = isdigit(uVar8);
  pWVar5 = *Fmt;
  uVar9 = (uint)(ushort)*pWVar5;
  if (iVar2 != 0) {
    iVar2 = isdigit(uVar9);
    pcVar10 = __nptr;
    while (iVar2 != 0) {
      *pcVar10 = (char)**Fmt;
      pcVar10 = pcVar10 + 1;
      pWVar5 = *Fmt;
      *Fmt = pWVar5 + 1;
      *pCVar12 = (CHAR)*pWVar5;
      pCVar12 = pCVar12 + 1;
      iVar2 = isdigit((uint)(ushort)**Fmt);
    }
    *pcVar10 = '\0';
    iVar2 = atoi(__nptr);
    *Width = iVar2;
    if (-1 < iVar2) goto LAB_0011a961;
LAB_0011a9e4:
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar4 = __errno_location();
      *piVar4 = 0x54f;
      return 0;
    }
LAB_0011ad32:
    abort();
  }
  if (uVar9 == 0x2a) {
    *Width = -2;
    *Fmt = pWVar5 + 1;
    *pCVar12 = '*';
    pCVar12 = Out + 2;
    iVar2 = isdigit((uint)(ushort)**Fmt);
    if (iVar2 != 0) {
      *Width = -3;
      while (iVar2 = isdigit((uint)(ushort)**Fmt), iVar2 != 0) {
        pWVar5 = *Fmt;
        *Fmt = pWVar5 + 1;
        *pCVar12 = (CHAR)*pWVar5;
        pCVar12 = pCVar12 + 1;
      }
    }
  }
LAB_0011a961:
  pCVar7 = pCVar12;
  if (**Fmt == L'.') {
    *Fmt = *Fmt + 1;
    pCVar7 = pCVar12 + 1;
    *pCVar12 = '.';
    iVar2 = isdigit((uint)(ushort)**Fmt);
    pWVar5 = *Fmt;
    uVar9 = (uint)(ushort)*pWVar5;
    if (iVar2 == 0) {
      if (uVar9 == 0x2a) {
        *Precision = -2;
        *Fmt = pWVar5 + 1;
        pCVar12[1] = '*';
        pCVar7 = pCVar12 + 2;
        iVar2 = isdigit((uint)(ushort)**Fmt);
        if (iVar2 != 0) {
          *Precision = -4;
          while (iVar2 = isdigit((uint)(ushort)**Fmt), iVar2 != 0) {
            pWVar5 = *Fmt;
            *Fmt = pWVar5 + 1;
            *pCVar7 = (CHAR)*pWVar5;
            pCVar7 = pCVar7 + 1;
          }
        }
      }
      else {
        *Precision = -3;
      }
    }
    else {
      iVar2 = isdigit(uVar9);
      pcVar10 = __nptr;
      while (iVar2 != 0) {
        *pcVar10 = (char)**Fmt;
        pcVar10 = pcVar10 + 1;
        pWVar5 = *Fmt;
        *Fmt = pWVar5 + 1;
        *pCVar7 = (CHAR)*pWVar5;
        pCVar7 = pCVar7 + 1;
        iVar2 = isdigit((uint)(ushort)**Fmt);
      }
      *pcVar10 = '\0';
      iVar2 = atoi(__nptr);
      *Precision = iVar2;
      if (iVar2 < 0) goto LAB_0011a9e4;
    }
  }
  pWVar5 = *Fmt;
  WVar1 = *pWVar5;
  if ((ushort)WVar1 < 0x6c) {
    if (WVar1 == L'I') {
      if (pWVar5[1] == L'3') {
        if (pWVar5[2] == L'2') {
          pWVar5 = pWVar5 + 3;
          goto LAB_0011aadb;
        }
LAB_0011ab0e:
        pWVar5 = pWVar5 + 1;
      }
      else {
        if ((pWVar5[1] != L'6') || (pWVar5[2] != L'4')) goto LAB_0011ab0e;
        pWVar5 = pWVar5 + 3;
      }
      *Fmt = pWVar5;
      goto LAB_0011ab15;
    }
    if (WVar1 != L'L') {
      if (WVar1 != L'h') goto LAB_0011ab1b;
      *Prefix = 1;
    }
    pWVar5 = pWVar5 + 1;
LAB_0011aadb:
    *Fmt = pWVar5;
  }
  else {
    if ((WVar1 == L'l') || (WVar1 == L'w')) {
      *Fmt = pWVar5 + 1;
      WVar1 = pWVar5[1];
      if (WVar1 == L'C') {
LAB_0011aac5:
        *Prefix = 4;
        if (WVar1 != L'l') goto LAB_0011ab1b;
      }
      else if (WVar1 != L'l') {
        if (WVar1 != L'S') goto LAB_0011ab1b;
        goto LAB_0011aac5;
      }
      *Prefix = 3;
      pWVar5 = pWVar5 + 2;
      goto LAB_0011aadb;
    }
    if (WVar1 != L'p') goto LAB_0011ab1b;
LAB_0011ab15:
    *Prefix = 3;
  }
LAB_0011ab1b:
  pWVar5 = *Fmt;
  WVar1 = *pWVar5;
  if ((ushort)WVar1 < 0x58) {
    if (WVar1 != L'C') {
      if (WVar1 != L'E') {
        if (WVar1 == L'S') goto switchD_0011ab40_caseD_73;
        goto switchD_0011ab40_caseD_68;
      }
      goto switchD_0011ab40_caseD_65;
    }
switchD_0011ab40_caseD_63:
    *Type = 1;
    if ((WVar1 == L'c') && (*Prefix != 1)) {
      *Prefix = 2;
    }
    if ((*Prefix == 4) || (*Prefix == 2)) {
      *pCVar7 = 'l';
      pCVar7 = pCVar7 + 1;
      *Prefix = 2;
    }
    *pCVar7 = 'c';
LAB_0011abf8:
    pCVar7 = pCVar7 + 1;
    *Fmt = *Fmt + 1;
  }
  else {
    switch(WVar1) {
    case L'c':
      goto switchD_0011ab40_caseD_63;
    case L'e':
    case L'f':
    case L'g':
switchD_0011ab40_caseD_65:
      if (*Prefix == 4) {
        *Prefix = 2;
      }
      *Type = 7;
      *Fmt = pWVar5 + 1;
      *pCVar7 = (CHAR)WVar1;
      break;
    case L'h':
    case L'j':
    case L'k':
    case L'l':
    case L'm':
    case L'n':
    case L'p':
    case L'q':
    case L'r':
    case L't':
    case L'v':
    case L'w':
switchD_0011ab40_caseD_68:
      if (WVar1 == L'p') {
        *Type = 5;
        *Fmt = pWVar5 + 1;
        if (*Prefix == 3) {
          if (*Precision == -1) {
            *Precision = 0x10;
            pCVar7[0] = '.';
            pCVar7[1] = '1';
            pCVar7[2] = '6';
            pCVar7 = pCVar7 + 3;
          }
          pCVar7[0] = 'l';
          pCVar7[1] = 'l';
          pCVar7 = pCVar7 + 2;
        }
        else {
          if (*Precision == -1) {
            *Precision = 8;
            pCVar7[0] = '.';
            pCVar7[1] = '8';
            pCVar7 = pCVar7 + 2;
          }
          if (*Prefix == 4) {
            *Prefix = 2;
          }
        }
        *pCVar7 = 'X';
        break;
      }
      if (WVar1 != L'n') {
        BVar11 = 0;
        if (WVar1 != L'G') goto LAB_0011ac6c;
        goto switchD_0011ab40_caseD_65;
      }
      if (*Prefix == 4) {
        *Prefix = 2;
      }
      if (*Prefix == 1) {
        *pCVar7 = 'h';
        pCVar7 = pCVar7 + 1;
      }
      pWVar5 = *Fmt;
      *Fmt = pWVar5 + 1;
      *pCVar7 = (CHAR)*pWVar5;
      pCVar7 = pCVar7 + 1;
      *Type = 6;
      goto LAB_0011ac66;
    case L's':
switchD_0011ab40_caseD_73:
      *Type = WVar1 == L'S' | 2;
      if ((WVar1 == L's') && (*Prefix != 1)) {
        *Prefix = 2;
      }
      if (*Prefix == 2) {
        *pCVar7 = 'l';
        pCVar7 = pCVar7 + 1;
      }
      *pCVar7 = 's';
      goto LAB_0011abf8;
    default:
      if (WVar1 != L'X') goto switchD_0011ab40_caseD_68;
    case L'd':
    case L'i':
    case L'o':
    case L'u':
    case L'x':
      *Type = 4;
      switch(*Prefix) {
      case 1:
        *pCVar7 = 'h';
        pCVar7 = pCVar7 + 1;
        break;
      case 2:
      case 4:
        *pCVar7 = 'l';
        pCVar7 = pCVar7 + 1;
        *Prefix = 2;
        break;
      case 3:
        pCVar7[0] = 'l';
        pCVar7[1] = 'l';
        pCVar7 = pCVar7 + 2;
      }
      pWVar5 = *Fmt;
      *Fmt = pWVar5 + 1;
      *pCVar7 = (CHAR)*pWVar5;
    }
    pCVar7 = pCVar7 + 1;
  }
LAB_0011ac66:
  BVar11 = 1;
LAB_0011ac6c:
  *pCVar7 = '\0';
  CorUnix::InternalFree(__nptr);
  return BVar11;
}

Assistant:

BOOL Internal_ExtractFormatW(CPalThread *pthrCurrent, LPCWSTR *Fmt, LPSTR Out, LPINT Flags,
    LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = (CHAR) *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) InternalMalloc(PAL_wcslen(*Fmt)+1);
    if (!TempStr)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
            case '-':
                *Flags |= PFF_MINUS; break;
            case '+':
                *Flags |= PFF_PLUS; break;
            case '0':
                *Flags |= PFF_ZERO; break;
            case ' ':
                *Flags |= PFF_SPACE; break;
            case '#':
                *Flags |= PFF_POUND; break;
        }
            *Out++ = (CHAR) *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit(**Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit(**Fmt))
        {
            *TempStrPtr++ = (CHAR) **Fmt;
            *Out++ = (CHAR) *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            ERROR("atoi returned a negative value indicative of an overflow.\n");
            pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = (CHAR) *(*Fmt)++;
        if (isdigit(**Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit(**Fmt))
            {
                *Out++ = (CHAR) *(*Fmt)++;
            }
        }
    }

    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = (CHAR) *(*Fmt)++;
        if (isdigit(**Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit(**Fmt))
            {
                *TempStrPtr++ = (CHAR) **Fmt;
                *Out++ = (CHAR) *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                ERROR("atoi returned a negative value indicative of an overflow.\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = (CHAR) *(*Fmt)++;
            if (isdigit(**Fmt))
            {
                /* this is an invalid precision because we have a .* then a number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit(**Fmt))
                {
                    *Out++ = (CHAR) *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    if ((*Fmt)[0] == 'I')
    {
        /* grab prefix of 'I64' for __int64 */
        if ((*Fmt)[1] == '6' && (*Fmt)[2] == '4')
        {
            /* convert to 'll' so that Unix snprintf can handle it */
            *Fmt += 3;
            *Prefix = PFF_PREFIX_LONGLONG;
        }
        /* grab prefix of 'I32' for __int32 */
        else if ((*Fmt)[1] == '3' && (*Fmt)[2] == '2')
        {
            *Fmt += 3;
        }
        else
        {
            ++(*Fmt);
    #ifdef BIT64
            /* convert to 'll' so that Unix snprintf can handle it */
            *Prefix = PFF_PREFIX_LONGLONG;
    #endif
        }
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
 #ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'C' || **Fmt == 'S')
#endif
        {
            *Prefix = PFF_PREFIX_LONG_W;
        }
        if (**Fmt == 'l')
        {
            *Prefix = PFF_PREFIX_LONGLONG;
            ++(*Fmt);
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }


    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'c')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG || *Prefix == PFF_PREFIX_LONG_W)
        {
            *Out++ = 'l';
            *Prefix = PFF_PREFIX_LONG;
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S' )
    {
        if ( **Fmt == 'S' )
        {
           *Type = PFF_TYPE_WSTRING;
        }
        else
        {
            *Type = PFF_TYPE_STRING;
        }
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 's')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }

        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG || *Prefix == PFF_PREFIX_LONG_W)
        {
            *Out++ = 'l';
            *Prefix = PFF_PREFIX_LONG;
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        if (*Prefix == PFF_PREFIX_LONG_W)
        {
            *Prefix = PFF_PREFIX_LONG;
        }

        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_LONG_W)
        {
            *Prefix = PFF_PREFIX_LONG;
        }

        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        (*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
                *Out++ = '.';
                *Out++ = '1';
                *Out++ = '6';
            }
            /* native *printf does not support %I64p
               (actually %llp), so we need to cheat a little bit */
            *Out++ = 'l';
            *Out++ = 'l';
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
                *Out++ = '.';
                *Out++ = '8';
            }
            if (*Prefix == PFF_PREFIX_LONG_W)
            {
                *Prefix = PFF_PREFIX_LONG;
            }
        }
        *Out++ = 'X';
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    InternalFree(TempStr);
    return Result;
}